

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::StandardNumericToDecimalCast<signed_char,long,duckdb::SignedToDecimalOperator>
               (char input,long *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  long lVar4;
  long lVar5;
  undefined7 in_register_00000081;
  uchar in_R9B;
  string error;
  allocator local_69;
  Exception local_68 [2];
  string local_48;
  
  uVar3 = CONCAT71(in_register_00000081,scale) & 0xffffffff;
  lVar1 = *(long *)(NumericHelper::POWERS_OF_TEN +
                   ((CONCAT71(in_register_00000009,width) & 0xffffffff) - uVar3) * 8);
  lVar4 = (long)input;
  lVar5 = -lVar1;
  bVar2 = SBORROW8(lVar4,lVar5) == lVar4 + lVar1 < 0;
  if ((lVar4 != lVar5 && bVar2) && lVar4 < lVar1) {
    *result = lVar4 * *(long *)(NumericHelper::POWERS_OF_TEN + uVar3 * 8);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_68,"Could not cast value %d to DECIMAL(%d,%d)",&local_69);
    Exception::ConstructMessage<signed_char,unsigned_char,unsigned_char>
              (&local_48,local_68,(string *)(ulong)(uint)(int)input,width,scale,in_R9B);
    ::std::__cxx11::string::~string((string *)local_68);
    HandleCastError::AssignError(&local_48,parameters);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return (lVar4 != lVar5 && bVar2) && lVar4 < lVar1;
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}